

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidgetPrivate::updateButtonIcons(QCalendarWidgetPrivate *this)

{
  QWidget *this_00;
  QToolButton *pQVar1;
  bool bVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QIcon QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar1 = this->prevMonth;
  pQVar3 = QWidget::style(this_00);
  bVar2 = QWidget::isRightToLeft(this_00);
  (**(code **)(*(long *)pQVar3 + 0x100))(&QStack_38,pQVar3,bVar2 | 0x34,0,this_00);
  QAbstractButton::setIcon(&pQVar1->super_QAbstractButton,&QStack_38);
  QIcon::~QIcon(&QStack_38);
  pQVar1 = this->nextMonth;
  pQVar3 = QWidget::style(this_00);
  bVar2 = QWidget::isRightToLeft(this_00);
  (**(code **)(*(long *)pQVar3 + 0x100))(&QStack_38,pQVar3,bVar2 ^ 0x35,0,this_00);
  QAbstractButton::setIcon(&pQVar1->super_QAbstractButton,&QStack_38);
  QIcon::~QIcon(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::updateButtonIcons()
{
    Q_Q(QCalendarWidget);
    prevMonth->setIcon(q->style()->standardIcon(q->isRightToLeft() ? QStyle::SP_ArrowRight : QStyle::SP_ArrowLeft, nullptr, q));
    nextMonth->setIcon(q->style()->standardIcon(q->isRightToLeft() ? QStyle::SP_ArrowLeft : QStyle::SP_ArrowRight, nullptr, q));
}